

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O2

void __thiscall llvm::FoldingSetNodeID::AddInteger(FoldingSetNodeID *this,long I)

{
  AddInteger(this,(uint)I);
  AddInteger(this,(uint)((ulong)I >> 0x20));
  return;
}

Assistant:

void FoldingSetNodeID::AddInteger(unsigned long I) {
  if (sizeof(long) == sizeof(int))
    AddInteger(unsigned(I));
  else if (sizeof(long) == sizeof(long long)) {
    AddInteger((unsigned long long)I);
  } else {
    llvm_unreachable("unexpected sizeof(long)");
  }
}